

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void __thiscall gnuplotio::FileHandleWrapper::fh_close(FileHandleWrapper *this)

{
  int iVar1;
  ostream *this_00;
  FileHandleWrapper *this_local;
  
  if ((this->should_use_pclose & 1U) == 0) {
    iVar1 = fclose((FILE *)this->wrapped_fh);
    if (iVar1 != 0) {
      this_00 = std::operator<<((ostream *)&std::cerr,"fclose returned error");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    iVar1 = pclose((FILE *)this->wrapped_fh);
    if (iVar1 != 0) {
      perror("pclose");
    }
  }
  return;
}

Assistant:

void fh_close() {
        if(should_use_pclose) {
            if(GNUPLOT_PCLOSE(wrapped_fh)) {
                perror("pclose");
                //char msg[1000];
                //strerror_s(msg, sizeof(msg), errno);
                //std::cerr << "pclose returned error: " << msg << std::endl;
            }
        } else {
            if(fclose(wrapped_fh)) {
                std::cerr << "fclose returned error" << std::endl;
            }
        }
    }